

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O1

uchar * __thiscall asl::SHA1::SHA1(SHA1 *this,uchar *d,size_t n,uchar *md)

{
  uchar *in_RAX;
  
  this->state[0] = 0x67452301;
  this->state[1] = 0xefcdab89;
  this->state[2] = 0x98badcfe;
  this->state[3] = 0x10325476;
  this->state[4] = 0xc3d2e1f0;
  this->count[0] = 0;
  this->count[1] = 0;
  this->buffer[0] = '\0';
  this->buffer[1] = '\0';
  this->buffer[2] = '\0';
  this->buffer[3] = '\0';
  this->buffer[4] = '\0';
  this->buffer[5] = '\0';
  this->buffer[6] = '\0';
  this->buffer[7] = '\0';
  this->buffer[8] = '\0';
  this->buffer[9] = '\0';
  this->buffer[10] = '\0';
  this->buffer[0xb] = '\0';
  this->buffer[0xc] = '\0';
  this->buffer[0xd] = '\0';
  this->buffer[0xe] = '\0';
  this->buffer[0xf] = '\0';
  this->buffer[0x10] = '\0';
  this->buffer[0x11] = '\0';
  this->buffer[0x12] = '\0';
  this->buffer[0x13] = '\0';
  this->buffer[0x14] = '\0';
  this->buffer[0x15] = '\0';
  this->buffer[0x16] = '\0';
  this->buffer[0x17] = '\0';
  this->buffer[0x18] = '\0';
  this->buffer[0x19] = '\0';
  this->buffer[0x1a] = '\0';
  this->buffer[0x1b] = '\0';
  this->buffer[0x1c] = '\0';
  this->buffer[0x1d] = '\0';
  this->buffer[0x1e] = '\0';
  this->buffer[0x1f] = '\0';
  this->buffer[0x20] = '\0';
  this->buffer[0x21] = '\0';
  this->buffer[0x22] = '\0';
  this->buffer[0x23] = '\0';
  this->buffer[0x24] = '\0';
  this->buffer[0x25] = '\0';
  this->buffer[0x26] = '\0';
  this->buffer[0x27] = '\0';
  this->buffer[0x28] = '\0';
  this->buffer[0x29] = '\0';
  this->buffer[0x2a] = '\0';
  this->buffer[0x2b] = '\0';
  this->buffer[0x2c] = '\0';
  this->buffer[0x2d] = '\0';
  this->buffer[0x2e] = '\0';
  this->buffer[0x2f] = '\0';
  this->buffer[0x30] = '\0';
  this->buffer[0x31] = '\0';
  this->buffer[0x32] = '\0';
  this->buffer[0x33] = '\0';
  this->buffer[0x34] = '\0';
  this->buffer[0x35] = '\0';
  this->buffer[0x36] = '\0';
  this->buffer[0x37] = '\0';
  this->buffer[0x38] = '\0';
  this->buffer[0x39] = '\0';
  this->buffer[0x3a] = '\0';
  this->buffer[0x3b] = '\0';
  this->buffer[0x3c] = '\0';
  this->buffer[0x3d] = '\0';
  this->buffer[0x3e] = '\0';
  this->buffer[0x3f] = '\0';
  return in_RAX;
}

Assistant:

SHA1::SHA1()
{
	state[0] = 0x67452301;
	state[1] = 0xEFCDAB89;
	state[2] = 0x98BADCFE;
	state[3] = 0x10325476;
	state[4] = 0xC3D2E1F0;
	count[0] = count[1] = 0;
	memset(buffer, 0, sizeof(buffer));
}